

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_scanline_aa.h
# Opt level: O0

bool __thiscall
agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::
sweep_scanline<agg::scanline_p8>
          (rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_> *this,scanline_p8 *sl
          )

{
  int iVar1;
  int iVar2;
  uint uVar3;
  cell_type **ppcVar4;
  int local_48;
  uint alpha;
  int area;
  int x;
  cell_aa *cur_cell;
  cell_type **ppcStack_30;
  int cover;
  cell_aa **cells;
  uint num_cells;
  scanline_p8 *sl_local;
  rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_> *this_local;
  
  do {
    iVar1 = this->m_scan_y;
    iVar2 = rasterizer_cells_aa<agg::cell_aa>::max_y(&this->m_outline);
    if (iVar2 < iVar1) {
      return false;
    }
    scanline_p8::reset_spans(sl);
    cells._4_4_ = rasterizer_cells_aa<agg::cell_aa>::scanline_num_cells
                            (&this->m_outline,this->m_scan_y);
    ppcStack_30 = rasterizer_cells_aa<agg::cell_aa>::scanline_cells(&this->m_outline,this->m_scan_y)
    ;
    cur_cell._4_4_ = 0;
    while (cells._4_4_ != 0) {
      _area = *ppcStack_30;
      alpha = _area->x;
      local_48 = _area->area;
      cur_cell._4_4_ = _area->cover + cur_cell._4_4_;
      while (cells._4_4_ = cells._4_4_ - 1, cells._4_4_ != 0) {
        ppcVar4 = ppcStack_30 + 1;
        _area = ppcStack_30[1];
        ppcStack_30 = ppcVar4;
        if (_area->x != alpha) break;
        local_48 = _area->area + local_48;
        cur_cell._4_4_ = _area->cover + cur_cell._4_4_;
      }
      if (local_48 != 0) {
        uVar3 = calculate_alpha(this,cur_cell._4_4_ * 0x200 - local_48);
        if (uVar3 != 0) {
          scanline_p8::add_cell(sl,alpha,uVar3);
        }
        alpha = alpha + 1;
      }
      if (((cells._4_4_ != 0) && ((int)alpha < _area->x)) &&
         (uVar3 = calculate_alpha(this,cur_cell._4_4_ << 9), uVar3 != 0)) {
        scanline_p8::add_span(sl,alpha,_area->x - alpha,uVar3);
      }
    }
    uVar3 = scanline_p8::num_spans(sl);
    if (uVar3 != 0) {
      scanline_p8::finalize(sl,this->m_scan_y);
      this->m_scan_y = this->m_scan_y + 1;
      return true;
    }
    this->m_scan_y = this->m_scan_y + 1;
  } while( true );
}

Assistant:

bool sweep_scanline(Scanline& sl)
        {
            for(;;)
            {
                if(m_scan_y > m_outline.max_y()) return false;
                sl.reset_spans();
                unsigned num_cells = m_outline.scanline_num_cells(m_scan_y);
                const cell_aa* const* cells = m_outline.scanline_cells(m_scan_y);
                int cover = 0;

                while(num_cells)
                {
                    const cell_aa* cur_cell = *cells;
                    int x    = cur_cell->x;
                    int area = cur_cell->area;
                    unsigned alpha;

                    cover += cur_cell->cover;

                    //accumulate all cells with the same X
                    while(--num_cells)
                    {
                        cur_cell = *++cells;
                        if(cur_cell->x != x) break;
                        area  += cur_cell->area;
                        cover += cur_cell->cover;
                    }

                    if(area)
                    {
                        alpha = calculate_alpha((cover << (poly_subpixel_shift + 1)) - area);
                        if(alpha)
                        {
                            sl.add_cell(x, alpha);
                        }
                        x++;
                    }

                    if(num_cells && cur_cell->x > x)
                    {
                        alpha = calculate_alpha(cover << (poly_subpixel_shift + 1));
                        if(alpha)
                        {
                            sl.add_span(x, cur_cell->x - x, alpha);
                        }
                    }
                }
        
                if(sl.num_spans()) break;
                ++m_scan_y;
            }

            sl.finalize(m_scan_y);
            ++m_scan_y;
            return true;
        }